

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SignalBenchmarks.hpp
# Opt level: O3

void benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Connect
               (BenchmarkContext *context,int64_t numSlots)

{
  pointer psVar1;
  ulong *puVar2;
  ulong uVar3;
  size_type sVar4;
  long lVar5;
  Storage<wigwag::token> *pSVar6;
  StorageArray<wigwag::token> c;
  HandlerType handler;
  IOperationProfilerPtr op;
  vector<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>,_std::allocator<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>_>
  s;
  Storage<wigwag::token> local_e8 [2];
  undefined1 local_d8 [16];
  StorageArray<wigwag::token> local_c8;
  _Any_data local_b8;
  code *local_a8;
  code *local_a0;
  ulong local_98;
  BenchmarkContext *local_90;
  long local_88;
  size_type local_80;
  anon_class_8_1_54a39803 local_78;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_70;
  vector<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>,_std::allocator<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>_>
  local_68;
  _Any_data local_50;
  code *local_40;
  
  sVar4 = context->_iterationsCount;
  local_b8._M_unused._M_object = (void *)0x0;
  local_b8._8_8_ = 0;
  local_a0 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_invoke;
  local_a8 = std::
             _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/koplyarov[P]wigwag/src/benchmarks/descriptors/signal/wigwag.hpp:36:45)>
             ::_M_manager;
  std::
  vector<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>,_std::allocator<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>_>
  ::vector(&local_68,sVar4,(allocator_type *)&local_e8[0]._obj);
  local_98 = sVar4 * numSlots;
  uVar3 = 0xffffffffffffffff;
  if (local_98 * 8 < 0xfffffffffffffff8) {
    uVar3 = local_98 * 8 + 8;
  }
  local_c8._size = local_98;
  puVar2 = (ulong *)operator_new__(-(ulong)(local_98 >> 0x3d != 0) | uVar3);
  *puVar2 = local_98;
  pSVar6 = (Storage<wigwag::token> *)(puVar2 + 1);
  local_e8[0] = (Storage<wigwag::token>)local_d8;
  local_c8._arr = pSVar6;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"connect","");
  (*context->_vptr_BenchmarkContext[3])(&local_78,context,local_e8,local_98);
  local_90 = context;
  if (local_e8[0] != (Storage<wigwag::token>)local_d8) {
    operator_delete((void *)local_e8[0]);
  }
  local_80 = sVar4;
  if (0 < (long)sVar4) {
    local_88 = numSlots * 8;
    sVar4 = 0;
    do {
      if (0 < numSlots) {
        lVar5 = 0;
        do {
          psVar1 = local_68.
                   super__Vector_base<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>,_std::allocator<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::function<void_()>::function
                    ((function<void_()> *)&local_50,(function<void_()> *)&local_b8);
          wigwag::
          signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
          ::connect<std::function<void()>>
                    ((signal<void(),wigwag::exception_handling::none,wigwag::threading::none,wigwag::state_populating::none,wigwag::life_assurance::none,wigwag::creation::lazy,wigwag::ref_counter::single_threaded>
                      *)&local_e8[0]._obj,(function<void_()> *)(psVar1 + sVar4),
                     (handler_attributes)&local_50);
          pSVar6[lVar5] = local_e8[0];
          local_e8[0] = (Storage<wigwag::token>)0x0;
          if (local_40 != (code *)0x0) {
            (*local_40)(&local_50,&local_50,__destroy_functor);
          }
          lVar5 = lVar5 + 1;
        } while (numSlots != lVar5);
      }
      sVar4 = sVar4 + 1;
      pSVar6 = (Storage<wigwag::token> *)((long)pSVar6 + local_88);
    } while (sVar4 != local_80);
  }
  if (local_70 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_70);
  }
  local_e8[0] = (Storage<wigwag::token>)local_d8;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"disconnect","");
  local_78.c = &local_c8;
  BenchmarkContext::
  Profile<benchmarks::SignalBenchmarks<descriptors::signal::wigwag::Ui>::Connect(benchmarks::BenchmarkContext&,long)::_lambda()_1_>
            (local_90,(string *)&local_e8[0]._obj,local_98,&local_78);
  if (local_e8[0] != (Storage<wigwag::token>)local_d8) {
    operator_delete((void *)local_e8[0]);
  }
  if (local_c8._arr != (Storage<wigwag::token> *)0x0) {
    operator_delete__(local_c8._arr + -1);
  }
  std::
  vector<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>,_std::allocator<wigwag::signal<void_(),_wigwag::exception_handling::none,_wigwag::threading::none,_wigwag::state_populating::none,_wigwag::life_assurance::none,_wigwag::creation::lazy,_wigwag::ref_counter::single_threaded>_>_>
  ::~vector(&local_68);
  if (local_a8 != (code *)0x0) {
    (*local_a8)(&local_b8,&local_b8,__destroy_functor);
  }
  return;
}

Assistant:

static void Connect(BenchmarkContext& context, int64_t numSlots)
        {
            const auto n = context.GetIterationsCount();

            HandlerType handler = SignalsDesc_::MakeHandler();
            std::vector<SignalType> s(n);
            StorageArray<ConnectionType> c(numSlots * n);

            {
                auto op = context.Profile("connect", numSlots * n);
                for (int64_t j = 0; j < n; ++j)
                    for (int64_t i = 0; i < numSlots; ++i)
                        c[i + j * numSlots].Construct(s[j].connect(handler));
            }

            context.Profile("disconnect", numSlots * n, [&]{ c.Destruct(); });
        }